

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

int __thiscall Clasp::Cli::ClaspAppBase::shutdown(ClaspAppBase *this,int __fd,int __how)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ClaspFacade *pCVar5;
  LemmaLogger *pLVar6;
  undefined4 extraout_var_00;
  StringBuilder *this_00;
  Output *pOVar7;
  undefined7 extraout_var;
  int __how_00;
  double dVar8;
  Summary *result;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  ClaspAppBase *in_stack_ffffffffffffff80;
  char local_50 [64];
  undefined8 local_10;
  ClaspAppBase *local_8;
  
  local_8 = this;
  pCVar5 = SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject>::get
                     ((SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject> *)0x116c48);
  if (pCVar5 == (ClaspFacade *)0x0) {
    uVar3 = 0;
  }
  else {
    pLVar6 = SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject>::get
                       ((SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject> *)0x116c64);
    if (pLVar6 != (LemmaLogger *)0x0) {
      pLVar6 = SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject>::operator->
                         ((SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject> *)0x116c7b);
      LemmaLogger::close(pLVar6,__fd);
    }
    iVar2 = 0;
    SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject>::operator=
              ((SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject> *)
               in_stack_ffffffffffffff80,
               (ProgramReader *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    pCVar5 = SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject>::operator->
                       ((SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject> *)0x116ca9);
    iVar2 = ClaspFacade::shutdown(pCVar5,iVar2,__how_00);
    local_10 = CONCAT44(extraout_var_00,iVar2);
    if (((double)shutdownTime_g != 0.0) || (NAN((double)shutdownTime_g))) {
      dVar8 = RealTime::getTime();
      shutdownTime_g = (StringBuilder *)((double)shutdownTime_g + dVar8);
      Potassco::StringBuilder::StringBuilder((StringBuilder *)0x116cf9);
      this_00 = Potassco::StringBuilder::appendFormat
                          (shutdownTime_g,local_50,"Shutdown completed in %.3f seconds");
      in_stack_ffffffffffffff80 = (ClaspAppBase *)Potassco::StringBuilder::c_str(this_00);
      (*(this->super_Application)._vptr_Application[7])(this,in_stack_ffffffffffffff80);
      Potassco::StringBuilder::~StringBuilder(this_00);
    }
    pOVar7 = SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::get
                       ((SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> *)0x116d7b);
    if (pOVar7 != (Output *)0x0) {
      pOVar7 = SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::operator->
                         ((SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> *)0x116d92);
      (*(pOVar7->super_EventHandler).super_ModelHandler._vptr_ModelHandler[6])(pOVar7,local_10);
    }
    uVar3 = Potassco::Application::getExitCode(&this->super_Application);
    uVar4 = exitCode(in_stack_ffffffffffffff80,
                     (RunSummary *)CONCAT44(uVar3,in_stack_ffffffffffffff78));
    Potassco::Application::setExitCode(&this->super_Application,uVar3 | uVar4);
    bVar1 = setFpuMode();
    uVar3 = (uint)CONCAT71(extraout_var,bVar1);
    if (bVar1) {
      uVar3 = fpuReset(this->fpuMode_);
    }
  }
  return uVar3;
}

Assistant:

void ClaspAppBase::shutdown() {
	if (!clasp_.get()) { return; }
	if (logger_.get()) { logger_->close(); }
	lemmaIn_ = 0;
	const ClaspFacade::Summary& result = clasp_->shutdown();
	if (shutdownTime_g) {
		shutdownTime_g += RealTime::getTime();
		info(POTASSCO_FORMAT("Shutdown completed in %.3f seconds", shutdownTime_g));
	}
	if (out_.get())  { out_->shutdown(result); }
	setExitCode(getExitCode() | exitCode(result));
	if (setFpuMode()){ fpuReset(fpuMode_); }
}